

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

int Cba_NtkCheckComboLoop_rec(Cba_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int local_24;
  int iFanin;
  int iFin;
  int k;
  int iObj_local;
  Cba_Ntk_t *p_local;
  
  iVar1 = Cba_ObjIsPi(p,iObj);
  if (iVar1 == 0) {
    iVar1 = Cba_ObjCopy(p,iObj);
    if (iVar1 == 1) {
      p_local._4_4_ = 1;
    }
    else {
      iVar1 = Cba_ObjCopy(p,iObj);
      if (iVar1 == 0) {
        p_local._4_4_ = 0;
      }
      else {
        Cba_ObjSetCopy(p,iObj,0);
        for (local_24 = Cba_ObjFin0(p,iObj); iVar1 = Cba_ObjFin0(p,iObj + 1), local_24 < iVar1;
            local_24 = local_24 + 1) {
          iVar1 = Cba_FinFon(p,local_24);
          iVar1 = Cba_FonObj(p,iVar1);
          if (((iVar1 != 0) && (iVar2 = Cba_ObjIsSeq(p,iVar1), iVar2 == 0)) &&
             (iVar1 = Cba_NtkCheckComboLoop_rec(p,iVar1), iVar1 == 0)) {
            return 0;
          }
        }
        Vec_IntSetEntry(&p->vObjCopy,iObj,1);
        p_local._4_4_ = 1;
      }
    }
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Cba_NtkCheckComboLoop_rec( Cba_Ntk_t * p, int iObj )
{
    int k, iFin, iFanin;
    if ( Cba_ObjIsPi(p, iObj) )
        return 1;
    if ( Cba_ObjCopy(p, iObj) == 1 ) // visited
        return 1;
    if ( Cba_ObjCopy(p, iObj) == 0 ) // loop
        return 0;
    Cba_ObjSetCopy( p, iObj, 0 );
    Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
        if ( !Cba_ObjIsSeq(p, iFanin) )
            if ( !Cba_NtkCheckComboLoop_rec( p, iFanin ) )
                return 0;
    //Cba_ObjSetCopy( p, iObj, 1 );
    Vec_IntSetEntry( &p->vObjCopy, iObj, 1 );
    return 1;
}